

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.h
# Opt level: O3

void pybind11::initialize_interpreter(bool init_signal_handlers)

{
  int iVar1;
  handle *handle;
  object local_40;
  handle local_38;
  accessor<pybind11::detail::accessor_policies::str_attr> local_30;
  
  iVar1 = Py_IsInitialized();
  if (iVar1 == 0) {
    Py_InitializeEx(init_signal_handlers);
    module::import((module *)&local_38,"sys");
    local_30.obj.m_ptr = local_38.m_ptr;
    local_30.key = "path";
    local_30.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    handle = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_30)
              ->super_handle;
    cast<pybind11::list,_0>((pybind11 *)&local_40,handle);
    list::append<char_const(&)[2]>((list *)&local_40,(char (*) [2])0x112782);
    object::~object(&local_40);
    object::~object(&local_30.cache);
    object::~object((object *)&local_38);
    return;
  }
  pybind11_fail("The interpreter is already running");
}

Assistant:

inline void initialize_interpreter(bool init_signal_handlers = true) {
    if (Py_IsInitialized())
        pybind11_fail("The interpreter is already running");

    Py_InitializeEx(init_signal_handlers ? 1 : 0);

    // Make .py files in the working directory available by default
    module::import("sys").attr("path").cast<list>().append(".");
}